

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecTree.c
# Opt level: O1

Acec_Box_t *
Acec_DeriveBox(Gia_Man_t *p,Vec_Bit_t *vIgnore,int fFilterIn,int fFilterOut,int fVerbose)

{
  int iVar1;
  Vec_Int_t *pVVar2;
  void *__ptr;
  Vec_Int_t *vAdds;
  Vec_Wec_t *__ptr_00;
  Acec_Box_t *pBox;
  ulong uVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  
  pBox = (Acec_Box_t *)0x0;
  vAdds = Ree_ManComputeCuts(p,(Vec_Int_t **)0x0,fVerbose);
  __ptr_00 = Acec_TreeFindTrees(p,vAdds,vIgnore,fFilterIn,fFilterOut);
  if (__ptr_00 != (Vec_Wec_t *)0x0) {
    if (__ptr_00->nSize < 1) {
      pBox = (Acec_Box_t *)0x0;
    }
    else {
      pBox = Acec_CreateBox(p,vAdds,__ptr_00->pArray);
      Acec_VerifyBoxLeaves(pBox,vIgnore);
    }
  }
  if (pBox != (Acec_Box_t *)0x0) {
    lVar4 = (long)pBox->vAdds->nSize;
    uVar7 = 0;
    uVar3 = 0;
    if (0 < lVar4) {
      lVar5 = 0;
      uVar3 = 0;
      do {
        uVar3 = (ulong)(uint)((int)uVar3 + *(int *)((long)&pBox->vAdds->pArray->nSize + lVar5));
        lVar5 = lVar5 + 0x10;
      } while (lVar4 << 4 != lVar5);
    }
    lVar5 = (long)pBox->vLeafLits->nSize;
    if (0 < lVar5) {
      lVar6 = 0;
      uVar7 = 0;
      do {
        uVar7 = (ulong)(uint)((int)uVar7 + *(int *)((long)&pBox->vLeafLits->pArray->nSize + lVar6));
        lVar6 = lVar6 + 0x10;
      } while (lVar5 * 0x10 != lVar6);
    }
    lVar5 = (long)pBox->vRootLits->nSize;
    if (lVar5 < 1) {
      uVar8 = 0;
    }
    else {
      lVar6 = 0;
      uVar8 = 0;
      do {
        uVar8 = (ulong)(uint)((int)uVar8 + *(int *)((long)&pBox->vRootLits->pArray->nSize + lVar6));
        lVar6 = lVar6 + 0x10;
      } while (lVar5 * 0x10 != lVar6);
    }
    printf("Processing tree %d:  Ranks = %d.  Adders = %d.  Leaves = %d.  Roots = %d.\n",0,lVar4,
           uVar3,uVar7,uVar8);
  }
  if ((fVerbose != 0) && (pBox != (Acec_Box_t *)0x0)) {
    Acec_TreePrintBox(pBox,vAdds);
  }
  if (__ptr_00 != (Vec_Wec_t *)0x0) {
    iVar1 = __ptr_00->nCap;
    if (0 < (long)iVar1) {
      pVVar2 = __ptr_00->pArray;
      lVar4 = 0;
      do {
        __ptr = *(void **)((long)&pVVar2->pArray + lVar4);
        if (__ptr != (void *)0x0) {
          free(__ptr);
          *(undefined8 *)((long)&pVVar2->pArray + lVar4) = 0;
        }
        lVar4 = lVar4 + 0x10;
      } while ((long)iVar1 * 0x10 != lVar4);
    }
    if (__ptr_00->pArray != (Vec_Int_t *)0x0) {
      free(__ptr_00->pArray);
      __ptr_00->pArray = (Vec_Int_t *)0x0;
    }
    __ptr_00->nCap = 0;
    __ptr_00->nSize = 0;
    free(__ptr_00);
  }
  if (vAdds->pArray != (int *)0x0) {
    free(vAdds->pArray);
    vAdds->pArray = (int *)0x0;
  }
  if (vAdds != (Vec_Int_t *)0x0) {
    free(vAdds);
  }
  return pBox;
}

Assistant:

Acec_Box_t * Acec_DeriveBox( Gia_Man_t * p, Vec_Bit_t * vIgnore, int fFilterIn, int fFilterOut, int fVerbose )
{
    Acec_Box_t * pBox = NULL;
    Vec_Int_t * vAdds = Ree_ManComputeCuts( p, NULL, fVerbose );
    Vec_Wec_t * vTrees = Acec_TreeFindTrees( p, vAdds, vIgnore, fFilterIn, fFilterOut );
    if ( vTrees && Vec_WecSize(vTrees) > 0 )
    {
        pBox = Acec_CreateBox( p, vAdds, Vec_WecEntry(vTrees, 0) );
        Acec_VerifyBoxLeaves( pBox, vIgnore );
    }
    if ( pBox )//&& fVerbose )
        printf( "Processing tree %d:  Ranks = %d.  Adders = %d.  Leaves = %d.  Roots = %d.\n", 
            0, Vec_WecSize(pBox->vAdds), Vec_WecSizeSize(pBox->vAdds), 
            Vec_WecSizeSize(pBox->vLeafLits), Vec_WecSizeSize(pBox->vRootLits)  );
    if ( pBox && fVerbose )
        Acec_TreePrintBox( pBox, vAdds );
    //Acec_PrintAdders( pBox0->vAdds, vAdds );
    //Acec_MultDetectInputs( p, pBox->vLeafLits, pBox->vRootLits );
    Vec_WecFreeP( &vTrees );
    Vec_IntFree( vAdds );
    return pBox;
}